

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_handle * fxp_opendir_recv(sftp_packet *pktin,sftp_request *req)

{
  sftp_request *req_local;
  sftp_packet *pktin_local;
  
  safefree(req);
  if (pktin->type == 0x66) {
    pktin_local = (sftp_packet *)fxp_got_handle(pktin);
  }
  else {
    fxp_got_status(pktin);
    sftp_pkt_free(pktin);
    pktin_local = (sftp_packet *)0x0;
  }
  return (fxp_handle *)pktin_local;
}

Assistant:

struct fxp_handle *fxp_opendir_recv(struct sftp_packet *pktin,
                                    struct sftp_request *req)
{
    sfree(req);
    if (pktin->type == SSH_FXP_HANDLE) {
        return fxp_got_handle(pktin);
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return NULL;
    }
}